

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable.cpp
# Opt level: O3

vector<std::byte,_std::allocator<std::byte>_> *
Cup::Properties::Readable::readBinary(string_view filename)

{
  file_type fVar1;
  char cVar2;
  size_type __n;
  runtime_error *prVar3;
  vector<std::byte,_std::allocator<std::byte>_> *in_RDI;
  path path;
  string message;
  directory_entry file;
  ifstream inputStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  path local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  directory_entry local_278;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  path local_238 [13];
  
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (local_238,&local_248,auto_format);
  std::filesystem::absolute(&local_2c0);
  std::filesystem::__cxx11::path::~path(local_238);
  std::filesystem::__cxx11::directory_entry::directory_entry(&local_278,&local_2c0);
  if ((local_278._M_type == symlink) || (fVar1 = local_278._M_type, local_278._M_type == none)) {
    fVar1 = std::filesystem::status(&local_278._M_path);
  }
  if ((byte)(fVar1 + not_found) < 0xfe) {
    if ((local_278._M_type == symlink) || (local_278._M_type == none)) {
      local_278._M_type = std::filesystem::status(&local_278._M_path);
    }
    if (local_278._M_type == regular) {
      std::ifstream::ifstream(local_238,local_2c0._M_pathname._M_dataplus._M_p,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::istream::seekg((long)local_238,_S_beg);
        __n = std::istream::tellg();
        std::istream::seekg((long)local_238,_S_beg);
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  (in_RDI,__n,(allocator_type *)&local_298);
        std::istream::read((char *)local_238,
                           (long)(in_RDI->super__Vector_base<std::byte,_std::allocator<std::byte>_>)
                                 ._M_impl.super__Vector_impl_data._M_start);
        std::ifstream::~ifstream(local_238);
        std::filesystem::__cxx11::path::~path(&local_278._M_path);
        std::filesystem::__cxx11::path::~path(&local_2c0);
        return in_RDI;
      }
      std::ifstream::~ifstream(local_238);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar3,"An unexpected error has occurred, this exception should not be thrown");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_238[0]._M_pathname._M_dataplus._M_p = (pointer)&local_238[0]._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,local_2c0._M_pathname._M_dataplus._M_p,
             local_2c0._M_pathname._M_dataplus._M_p + local_2c0._M_pathname._M_string_length);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"The file with path <","");
  std::operator+(&local_320,&local_340,&local_238[0]._M_pathname);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_360,"> not exist, not is a regular file","");
  std::operator+(&local_300,&local_320,&local_360);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_380," or the path is wrong.\nPlease assure that path is","");
  std::operator+(&local_2e0,&local_300,&local_380);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a0," valid and the file not is a directory.","");
  std::operator+(&local_298,&local_2e0,&local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,(string *)&local_298);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::byte> Properties::Readable::readBinary(std::string_view filename)
{
	// Get the absolute path to file, is more simple
	// inform of error with the absolute path.
	const fs::path path(fs::absolute(filename));
	// Verify that the file exist and that it is regular file
	const fs::directory_entry file(path);

	if (file.exists() and file.is_regular_file())
	{
		// Open the file in mode only read and read of binary
		std::ifstream inputStream(path, std::ios::binary);

		// Checks if the stream has an associated file
		if (inputStream.is_open())
		{
			// You can imagine ifstream as a position,
			// and that position has the ability to
			// move through the file, you can move
			// anywhere within the file and read content
			// from that position.
			// What we want to do is determine the
			// size of the file to read it completely
			// in a single iteration, so our position
			// needs to move to the end of the file,
			// and then ask him where he is.
			inputStream.seekg(0, std::ifstream::end);
			// This is how we ask our position where it is
			const std::size_t sizeFile = inputStream.tellg();
			// To read the entire contents of the file,
			// it is necessary to move back to the beginning
			// of the file
			inputStream.seekg(0, std::ifstream::beg);

			// std::byte was introduced in C++17, allowing
			// interpret unsigned char and char as a byte

			// See the motivations of use std::byte instead
			// of unsigned char and char

			// 		Many programs require byte-oriented access
			// 		to memory. Today, such programs must use
			// 		either the char, signed char, or unsigned
			// 		char types for this purpose. However, these
			// 		types perform a “triple duty”. Not only are
			// 		they used for byte addressing, but also as
			// 		arithmetic types, and as character types.
			// 		This multiplicity of roles opens the door
			// 		for programmer error – such as accidentally
			// 		performing arithmetic on memory that should
			// 		be treated as a byte value – and confusion
			// 		for both programmers and tools.
			// Ref: http://open-std.org/JTC1/SC22/WG21/docs/papers/2016/p0298r0.pdf
			std::vector<std::byte> buffer(sizeFile);

			// The "reinterpret_cast<char*>" is necessary,
			// yet that the method read not support to read
			// of std::byte type, only of pointers (aka: arrays)
			// of type char
			inputStream.read(reinterpret_cast<char*>(buffer.data()), sizeFile);

			return buffer;
		}
	}
	else
	{
		// For create std::string in compilation
		// time is necessary say to compile that the
		// string literal [aka: const char*] will
		// be convert to std::string; note the 's'
		// added to end of string literals.
		using namespace std::string_literals;

		const std::string pathAbsolute = path;
		const std::string message = "The file with path <"s
				+ pathAbsolute + "> not exist, not is a regular file"s
				+ " or the path is wrong.\nPlease assure that path is"s
				+ " valid and the file not is a directory."s;

		throw std::runtime_error(message);
	}

	throw std::runtime_error("An unexpected error has occurred,"
						  " this exception should not be thrown");
}